

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_basetableref.cpp
# Opt level: O1

unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true> __thiscall
duckdb::Binder::Bind(Binder *this,BaseTableRef *ref)

{
  __node_base *__y;
  unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true> *this_00;
  size_type *retriever;
  pointer pLVar1;
  CommonTableExpressionInfo *cte;
  pointer pcVar2;
  ClientContext *context;
  optional_ptr<duckdb::CatalogEntry,_true> oVar3;
  pointer pbVar4;
  char cVar5;
  bool bVar6;
  BindingMode BVar7;
  int iVar8;
  int iVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *column_aliases;
  pointer pSVar10;
  pointer pQVar11;
  undefined7 extraout_var;
  reference pvVar12;
  __node_base_ptr index;
  mapped_type *pmVar13;
  type puVar14;
  pointer pBVar15;
  string *psVar16;
  BinderException *pBVar17;
  optional_ptr<duckdb::BoundAtClause,_true> at_clause_p;
  idx_t iVar18;
  StatementProperties *this_01;
  undefined4 extraout_var_02;
  ColumnList *pCVar19;
  DBConfig *pDVar20;
  size_t sVar21;
  undefined8 uVar22;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 extraout_RAX_01;
  undefined7 extraout_var_01;
  undefined8 extraout_RAX_02;
  undefined8 extraout_RAX_03;
  undefined8 extraout_RAX_04;
  Binder *pBVar23;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  Binder *pBVar24;
  pointer this_02;
  BoundSubqueryRef *pBVar25;
  pointer pBVar26;
  ColumnDefinition *this_03;
  LogicalType *pLVar27;
  string *psVar28;
  pointer pLVar29;
  vector<duckdb::ColumnIndex,_true> *bound_column_ids;
  undefined4 extraout_var_06;
  type subquery_00;
  undefined8 *puVar30;
  element_type *peVar31;
  InvalidInputException *this_04;
  InternalException *pIVar32;
  FileSystem *pFVar33;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar34;
  idx_t iVar35;
  long in_RDX;
  string *psVar36;
  ulong __n;
  long lVar37;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar38;
  char cVar39;
  char *pcVar40;
  size_type sVar41;
  size_type __n_00;
  LogicalType *rhs;
  bool bVar42;
  ColumnListIterator CVar43;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  optional_ptr<duckdb::CatalogEntry,_true> table_or_view;
  optional_ptr<duckdb::Binding,_true> ctebinding;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> cte_reference;
  string full_path;
  mapped_type cteref;
  templated_unique_single_t result;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> bind_data;
  unique_ptr<duckdb::BoundAtClause,_std::default_delete<duckdb::BoundAtClause>,_true> at_clause;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  return_names;
  optional_ptr<duckdb::TableCatalogEntry,_true> table_entry;
  idx_t table_index;
  EntryLookupInfo table_lookup;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  SubqueryRef subquery;
  optional_ptr<duckdb::CatalogEntry,_true> local_5b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_5a8;
  undefined1 local_588 [8];
  element_type *peStack_580;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_578;
  float local_568;
  size_t local_560;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_558;
  undefined1 local_548 [64];
  undefined1 local_508 [40];
  string *local_4e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d8;
  pointer local_4c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4c0;
  undefined1 local_4b8 [16];
  undefined1 local_4a8 [48];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_478;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> local_460;
  __node_base local_458;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_450;
  EntryLookupInfo local_438;
  string *local_418;
  __node_base local_410;
  undefined1 *local_408 [2];
  undefined1 local_3f8 [16];
  QueryErrorContext local_3e8;
  pointer local_3e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3d0;
  string local_3c8;
  undefined1 local_3a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398 [4];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_358;
  __node_base local_348;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> local_340;
  __node_base local_228;
  __node_base local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  _Any_data local_1c8;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [32];
  vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_> local_188;
  undefined1 local_170 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  __node_base local_140 [2];
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  undefined1 local_f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined7 extraout_var_00;
  
  local_3e8.query_location.index = *(optional_idx *)(in_RDX + 0x38);
  psVar28 = (string *)(in_RDX + 0x88);
  if ((*(long *)(in_RDX + 0x90) == 0) ||
     (iVar8 = ::std::__cxx11::string::compare((char *)psVar28), iVar8 == 0)) {
    sVar21 = *(size_t *)(in_RDX + 0xb0);
    if (sVar21 == *(size_t *)((long)&ref[1].table_name.field_2 + 8)) {
      if (sVar21 == 0) {
        bVar42 = true;
      }
      else {
        iVar8 = bcmp((((string *)(in_RDX + 0xa8))->_M_dataplus)._M_p,
                     (void *)ref[1].table_name.field_2._M_allocated_capacity,sVar21);
        bVar42 = iVar8 == 0;
      }
    }
    else {
      bVar42 = false;
    }
    FindCTE((vector<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_true> *)local_3a8,
            (Binder *)ref,(string *)(in_RDX + 0xa8),bVar42);
    paVar38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a8._0_8_;
  }
  else {
    local_3a8._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    paVar38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
  }
  local_4e0 = psVar28;
  local_4c0 = paVar38;
  if (paVar38 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._8_8_) {
    local_4a8._8_8_ = &ref->schema_name;
    aStack_558._8_8_ = in_RDX + 0xa8;
    psVar28 = (string *)(in_RDX + 0x10);
    column_aliases =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *)(in_RDX + 0x50);
    local_3d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)&PTR__SubqueryRef_02493370;
    local_3e0 = (pointer)&PTR__BoundCTERef_0248e2a8;
    local_410._M_nxt = (_Hash_node_base *)0x0;
    psVar36 = (string *)0x0;
    local_418 = psVar28;
    local_3d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._8_8_;
    do {
      cte = (CommonTableExpressionInfo *)paVar38->_M_allocated_capacity;
      local_4a8._32_8_ = psVar36;
      local_5a8.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)BindContext::GetCTEBinding
                              ((BindContext *)local_4a8._8_8_,(string *)aStack_558._8_8_);
      if ((Binding *)
          local_5a8.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start == (Binding *)0x0) {
LAB_011f899c:
        bVar6 = CTEIsAlreadyBound((Binder *)ref,cte);
        bVar42 = true;
        psVar28 = (string *)CONCAT71((int7)((ulong)psVar28 >> 8),1);
        psVar16 = (string *)CONCAT71(extraout_var,bVar6);
        if (!bVar6) {
          if (cte->materialized == CTE_MATERIALIZE_ALWAYS) {
            pBVar17 = (BinderException *)__cxa_allocate_exception(0x10);
            local_3a8._0_8_ = local_3a8 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_3a8,
                       "There is a WITH item named \"%s\", but it cannot be referenced from this part of the query."
                       ,"");
            local_70._M_allocated_capacity = (size_type)&local_60;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_70,*(long *)(in_RDX + 0xa8),
                       *(long *)(in_RDX + 0xb0) + *(long *)(in_RDX + 0xa8));
            BinderException::BinderException<std::__cxx11::string>
                      (pBVar17,(string *)local_3a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_70);
            __cxa_throw(pBVar17,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
          iVar8 = ::std::__cxx11::string::compare((char *)local_4e0);
          if (iVar8 == 0) {
            pBVar17 = (BinderException *)__cxa_allocate_exception(0x10);
            local_3a8._0_8_ = local_3a8 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_3a8,
                       "There is a WITH item named \"%s\", but the recurring table cannot be referenced from this part of the query."
                       ,"");
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_90,*(long *)(in_RDX + 0xa8),
                       *(long *)(in_RDX + 0xb0) + *(long *)(in_RDX + 0xa8));
            BinderException::BinderException<std::__cxx11::string>
                      (pBVar17,(string *)local_3a8,&local_90);
            __cxa_throw(pBVar17,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
          pSVar10 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                    ::operator->(&cte->query);
          (*(pSVar10->super_SQLStatement)._vptr_SQLStatement[3])(local_4a8 + 0x18,pSVar10);
          local_4a8._40_8_ = local_4a8._24_8_;
          local_4a8._24_8_ = (_Hash_node_base *)0x0;
          local_3c8._M_string_length = 0;
          local_3c8.field_2._M_local_buf[0] = '\0';
          local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
          SubqueryRef::SubqueryRef
                    ((SubqueryRef *)local_3a8,
                     (unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                      *)(local_4a8 + 0x28),&local_3c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
            operator_delete(local_3c8._M_dataplus._M_p);
          }
          if ((_Hash_node_base *)local_4a8._40_8_ != (_Hash_node_base *)0x0) {
            (*(code *)(*(_Hash_node_base **)local_4a8._40_8_)[1]._M_nxt)();
          }
          local_4a8._40_8_ = (_Hash_node_base *)0x0;
          if ((_Hash_node_base *)local_4a8._24_8_ != (_Hash_node_base *)0x0) {
            (*(code *)(*(_Hash_node_base **)local_4a8._24_8_)[1]._M_nxt)();
          }
          local_4a8._24_8_ = (_Hash_node_base *)0x0;
          ::std::__cxx11::string::_M_assign((string *)(local_3a8 + 0x10));
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_358._M_local_buf,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)cte);
          if (*(long *)(in_RDX + 0x58) != *(long *)(in_RDX + 0x50)) {
            __n = 0;
            do {
              if (__n < (ulong)((long)(local_358._8_8_ - local_358._0_8_) >> 5)) {
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ::operator[](column_aliases,__n);
                pvVar12 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                        *)&local_358,__n);
                ::std::__cxx11::string::_M_assign((string *)pvVar12);
              }
              else {
                pvVar12 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                          ::operator[](column_aliases,__n);
                ::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_358._M_local_buf,pvVar12);
              }
              __n = __n + 1;
            } while (__n < (ulong)(*(long *)(in_RDX + 0x58) - *(long *)(in_RDX + 0x50) >> 5));
          }
          Bind(this,(SubqueryRef *)ref,(CommonTableExpressionInfo *)local_3a8);
          local_3a8._0_8_ = local_3d8;
          if ((_Head_base<0UL,_duckdb::SelectStatement_*,_false>)local_340._M_head_impl !=
              (_Head_base<0UL,_duckdb::SelectStatement_*,_false>)0x0) {
            (*((local_340._M_head_impl)->super_SQLStatement)._vptr_SQLStatement[1])();
          }
          local_340._M_head_impl = (SelectStatement *)0x0;
          TableRef::~TableRef((TableRef *)local_3a8);
          goto LAB_011f8fa3;
        }
      }
      else {
        pSVar10 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                  ::operator->(&cte->query);
        pQVar11 = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::
                  operator->(&pSVar10->node);
        if ((pQVar11->type != RECURSIVE_CTE_NODE) && (cte->materialized != CTE_MATERIALIZE_ALWAYS))
        goto LAB_011f899c;
        index = (__node_base_ptr)GenerateTableIndex((Binder *)ref);
        cVar39 = (char)*(undefined4 *)&cte->materialized;
        if (cVar39 == '\x01') {
          cVar39 = '\x03';
        }
        iVar8 = ::std::__cxx11::string::compare((char *)local_4e0);
        if ((iVar8 == 0) &&
           ((cte->key_targets).
            super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            (cte->key_targets).
            super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)) {
          this_04 = (InvalidInputException *)__cxa_allocate_exception(0x10);
          local_3a8._0_8_ = local_3a8 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_3a8,
                     "RECURRING can only be used with USING KEY in recursive CTE.","");
          InvalidInputException::InvalidInputException(this_04,(string *)local_3a8);
          __cxa_throw(this_04,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error)
          ;
        }
        optional_ptr<duckdb::Binding,_true>::CheckValid
                  ((optional_ptr<duckdb::Binding,_true> *)&local_5a8);
        pbVar4 = local_5a8.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar8 = ::std::__cxx11::string::compare((char *)local_4e0);
        local_4d8._M_allocated_capacity = (size_type)operator_new(0x60);
        iVar18 = *(idx_t *)((long)pbVar4 + 0x70);
        *(undefined1 *)
         &(((element_type *)local_4d8._M_allocated_capacity)->
          super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
          super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = 7;
        ((element_type *)local_4d8._M_allocated_capacity)->context = (ClientContext *)0x0;
        *(pointer *)
         &(((element_type *)local_4d8._M_allocated_capacity)->
          super_enable_shared_from_this<duckdb::Binder>).__weak_this_ = local_3e0;
        (((element_type *)local_4d8._M_allocated_capacity)->CTE_bindings)._M_h._M_buckets =
             (__buckets_ptr)0x0;
        (((element_type *)local_4d8._M_allocated_capacity)->CTE_bindings)._M_h._M_bucket_count = 0;
        (((element_type *)local_4d8._M_allocated_capacity)->CTE_bindings)._M_h._M_before_begin.
        _M_nxt = (_Hash_node_base *)0x0;
        (((element_type *)local_4d8._M_allocated_capacity)->CTE_bindings)._M_h._M_element_count = 0;
        *(undefined8 *)
         &(((element_type *)local_4d8._M_allocated_capacity)->CTE_bindings)._M_h._M_rehash_policy =
             0;
        (((element_type *)local_4d8._M_allocated_capacity)->CTE_bindings)._M_h._M_rehash_policy.
        _M_next_resize = 0;
        (((element_type *)local_4d8._M_allocated_capacity)->CTE_bindings)._M_h._M_single_bucket =
             index;
        (((element_type *)local_4d8._M_allocated_capacity)->bound_ctes)._M_h._M_buckets =
             (__buckets_ptr)iVar18;
        *(char *)&(((element_type *)local_4d8._M_allocated_capacity)->bound_ctes)._M_h.
                  _M_bucket_count = cVar39;
        *(bool *)((long)&(((element_type *)local_4d8._M_allocated_capacity)->bound_ctes)._M_h.
                         _M_bucket_count + 1) = iVar8 == 0;
        uVar22 = local_418;
        if (*(long *)(in_RDX + 0x18) == 0) {
          uVar22 = aStack_558._8_8_;
        }
        local_3a8._0_8_ = local_3a8 + 0x10;
        pcVar2 = (((string *)uVar22)->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_3a8,pcVar2,pcVar2 + ((string *)uVar22)->_M_string_length);
        optional_ptr<duckdb::Binding,_true>::CheckValid
                  ((optional_ptr<duckdb::Binding,_true> *)&local_5a8);
        psVar28 = local_4e0;
        BindContext::AliasColumnNames
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    *)&local_438,(string *)local_3a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    *)((long)local_5a8.
                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + 0x90),column_aliases);
        optional_ptr<duckdb::Binding,_true>::CheckValid
                  ((optional_ptr<duckdb::Binding,_true> *)&local_5a8);
        BindContext::AddGenericBinding
                  ((BindContext *)local_4a8._8_8_,(idx_t)index,(string *)local_3a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    *)&local_438,
                   (vector<duckdb::LogicalType,_true> *)
                   ((long)local_5a8.
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 0x78));
        lVar37 = *(long *)(in_RDX + 0x90);
        if (lVar37 == 0) {
          local_588 = (undefined1  [8])&local_578;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_588,*(long *)(in_RDX + 0xa8),
                     *(long *)(in_RDX + 0xb0) + *(long *)(in_RDX + 0xa8));
        }
        else {
          local_408[0] = local_3f8;
          pcVar2 = (psVar28->_M_dataplus)._M_p;
          ::std::__cxx11::string::_M_construct<char*>((string *)local_408,pcVar2,pcVar2 + lVar37);
          ::std::__cxx11::string::append((char *)local_408);
          puVar30 = (undefined8 *)
                    ::std::__cxx11::string::_M_append((char *)local_408,*(ulong *)(in_RDX + 0xa8));
          paVar34 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar30 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar30 == paVar34) {
            local_578._M_allocated_capacity = paVar34->_M_allocated_capacity;
            local_578._8_8_ = puVar30[3];
            local_588 = (undefined1  [8])&local_578;
          }
          else {
            local_578._M_allocated_capacity = paVar34->_M_allocated_capacity;
            local_588 = (undefined1  [8])*puVar30;
          }
          peStack_580 = (element_type *)puVar30[1];
          *puVar30 = paVar34;
          puVar30[1] = 0;
          *(undefined1 *)(puVar30 + 2) = 0;
        }
        if ((lVar37 != 0) && (local_408[0] != local_3f8)) {
          operator_delete(local_408[0]);
        }
        pmVar13 = ::std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)local_4a8._8_8_,(key_type *)local_588);
        local_508._0_8_ =
             (pmVar13->internal).super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
        local_508._8_8_ =
             (pmVar13->internal).super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_508._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_508._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_508._8_8_)->_M_use_count + 1
            ;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_508._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_508._8_8_)->_M_use_count + 1
            ;
          }
        }
        if (((pointer)local_508._0_8_ == (pointer)0x0) &&
           (iVar8 = ::std::__cxx11::string::compare((char *)psVar28), iVar8 == 0)) {
          pBVar17 = (BinderException *)__cxa_allocate_exception(0x10);
          local_548._0_8_ = local_548 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_548,
                     "There is a WITH item named \"%s\", but the recurring table cannot be referenced from this part of the query."
                     ,"");
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,*(long *)(in_RDX + 0xa8),
                     *(long *)(in_RDX + 0xb0) + *(long *)(in_RDX + 0xa8));
          BinderException::BinderException<std::__cxx11::string>
                    (pBVar17,(string *)local_548,&local_50);
          __cxa_throw(pBVar17,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        puVar14 = shared_ptr<unsigned_long,_true>::operator*
                            ((shared_ptr<unsigned_long,_true> *)local_508);
        *puVar14 = *puVar14 + 1;
        optional_ptr<duckdb::Binding,_true>::CheckValid
                  ((optional_ptr<duckdb::Binding,_true> *)&local_5a8);
        pbVar4 = local_5a8.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pBVar15 = unique_ptr<duckdb::BoundCTERef,_std::default_delete<duckdb::BoundCTERef>,_true>::
                  operator->((unique_ptr<duckdb::BoundCTERef,_std::default_delete<duckdb::BoundCTERef>,_true>
                              *)&local_4d8._M_allocated_capacity);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
                  (&(pBVar15->types).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                   (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                   ((long)pbVar4 + 0x78));
        pBVar15 = unique_ptr<duckdb::BoundCTERef,_std::default_delete<duckdb::BoundCTERef>,_true>::
                  operator->((unique_ptr<duckdb::BoundCTERef,_std::default_delete<duckdb::BoundCTERef>,_true>
                              *)&local_4d8._M_allocated_capacity);
        local_548._0_8_ =
             (pBVar15->bound_columns).
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_548._8_8_ =
             (pBVar15->bound_columns).
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_548._16_8_ =
             (pBVar15->bound_columns).
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (pBVar15->bound_columns).
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_438._0_8_;
        (pBVar15->bound_columns).
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = local_438.name;
        (pBVar15->bound_columns).
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = &(local_438.at_clause.ptr)->unit;
        local_438._0_8_ = (pointer)0x0;
        local_438.name = (pointer)0x0;
        local_438.at_clause.ptr = (BoundAtClause *)0x0;
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_548);
        uVar22 = local_4d8._M_allocated_capacity;
        local_4d8._M_allocated_capacity = 0;
        (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
        super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)uVar22
        ;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_508._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_508._8_8_);
        }
        if (local_588 != (undefined1  [8])&local_578) {
          operator_delete((void *)local_588);
        }
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_438);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a8._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_3a8 + 0x10)) {
          operator_delete((void *)local_3a8._0_8_);
        }
        if ((long *)local_4d8._M_allocated_capacity != (long *)0x0) {
          (**(code **)(*(long *)local_4d8._M_allocated_capacity + 8))();
        }
LAB_011f8fa3:
        bVar42 = false;
        psVar28 = (string *)(local_4a8._32_8_ & 0xffffffff);
        psVar16 = (string *)local_4a8._32_8_;
      }
      if (!bVar42) break;
      paVar38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(paVar38->_M_local_buf + 8);
      psVar36 = (string *)((ulong)psVar28 & 0xffffffff);
      local_410._M_nxt =
           (_Hash_node_base *)CONCAT71((int7)((ulong)psVar16 >> 8),paVar38 == local_3d0);
    } while (paVar38 != local_3d0);
    if (((ulong)local_410._M_nxt & 1) == 0) goto LAB_011fa231;
    if (((ulong)psVar28 & 1) != 0) {
      BindWithReplacementScan
                (this,(ClientContext *)ref,
                 (BaseTableRef *)(ref->super_TableRef).alias._M_dataplus._M_p);
      if ((this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
          super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0
         ) {
        pBVar17 = (BinderException *)__cxa_allocate_exception(0x10);
        local_3a8._0_8_ = local_3a8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_3a8,
                   "Circular reference to CTE \"%s\", There are two possible solutions. \n1. use WITH RECURSIVE to use recursive CTEs. \n2. If you want to use the TABLE name \"%s\" the same as the CTE name, please explicitly add \"SCHEMA\" before table name. You can try \"main.%s\" (main is the duckdb default schema)"
                   ,"");
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,*(long *)(in_RDX + 0xa8),
                   *(long *)(in_RDX + 0xb0) + *(long *)(in_RDX + 0xa8));
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d0,*(long *)(in_RDX + 0xa8),
                   *(long *)(in_RDX + 0xb0) + *(long *)(in_RDX + 0xa8));
        local_f0._0_8_ = local_f0 + 0x10;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_f0,*(long *)(in_RDX + 0xa8),
                   *(long *)(in_RDX + 0xb0) + *(long *)(in_RDX + 0xa8));
        BinderException::
        BinderException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                  (pBVar17,(string *)local_3a8,&local_b0,&local_d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0);
        __cxa_throw(pBVar17,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      goto LAB_011fa231;
    }
  }
  BindAtClause((Binder *)local_4a8,(optional_ptr<duckdb::AtClause,_true>)ref);
  at_clause_p.ptr = (BoundAtClause *)local_4a8._0_8_;
  if ((element_type *)local_4a8._0_8_ == (element_type *)0x0) {
    at_clause_p = CatalogEntryRetriever::GetAtClause
                            ((CatalogEntryRetriever *)&ref[3].catalog_name._M_string_length);
  }
  pBVar24 = (Binder *)(in_RDX + 0xa8);
  EntryLookupInfo::EntryLookupInfo(&local_438,TABLE_ENTRY,(string *)pBVar24,at_clause_p,local_3e8);
  psVar28 = local_4e0;
  retriever = &ref[3].catalog_name._M_string_length;
  psVar36 = (string *)(in_RDX + 0x68);
  BindSchemaOrCatalog((CatalogEntryRetriever *)retriever,psVar36,local_4e0);
  local_5b0 = CatalogEntryRetriever::GetEntry
                        ((CatalogEntryRetriever *)retriever,psVar36,psVar28,&local_438,RETURN_NULL);
  BVar7 = GetBindingMode((Binder *)ref);
  if ((BVar7 == EXTRACT_NAMES) &&
     (((ViewCatalogEntry *)local_5b0.ptr == (ViewCatalogEntry *)0x0 ||
      (optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&local_5b0),
      (local_5b0.ptr)->type == TABLE_ENTRY)))) {
    local_1a8._0_8_ = (ClientContext *)(local_1a8 + 0x10);
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_1a8,*(long *)(in_RDX + 0xa8),
               *(long *)(in_RDX + 0xb0) + *(long *)(in_RDX + 0xa8));
    AddTableName((Binder *)ref,(string *)local_1a8);
    if ((ClientContext *)local_1a8._0_8_ != (ClientContext *)(local_1a8 + 0x10)) {
      operator_delete((void *)local_1a8._0_8_);
    }
    iVar18 = GenerateTableIndex((Binder *)ref);
    pBVar23 = (Binder *)(in_RDX + 0x10);
    if (*(long *)(in_RDX + 0x18) == 0) {
      pBVar23 = pBVar24;
    }
    peVar31 = (pBVar23->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
              super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_3a8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_3a8 + 0x10);
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_3a8,peVar31,
               (pointer)((long)&((pBVar23->super_enable_shared_from_this<duckdb::Binder>).
                                 __weak_this_.internal.
                                 super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi)->_vptr__Sp_counted_base + (long)peVar31));
    LogicalType::LogicalType((LogicalType *)local_588,INTEGER);
    __l._M_len = 1;
    __l._M_array = (iterator)local_588;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_508,__l,
               (allocator_type *)local_548);
    LogicalType::~LogicalType((LogicalType *)local_588);
    cVar39 = '\x01';
    if (9 < iVar18) {
      iVar35 = iVar18;
      cVar5 = '\x04';
      do {
        cVar39 = cVar5;
        if (iVar35 < 100) {
          cVar39 = cVar39 + -2;
          goto LAB_011fa0c8;
        }
        if (iVar35 < 1000) {
          cVar39 = cVar39 + -1;
          goto LAB_011fa0c8;
        }
        if (iVar35 < 10000) goto LAB_011fa0c8;
        bVar42 = 99999 < iVar35;
        iVar35 = iVar35 / 10000;
        cVar5 = cVar39 + '\x04';
      } while (bVar42);
      cVar39 = cVar39 + '\x01';
    }
LAB_011fa0c8:
    local_548._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_548 + 0x10);
    ::std::__cxx11::string::_M_construct((ulong)local_548,cVar39);
    ::std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)local_548._0_8_,local_548._8_4_,iVar18);
    puVar30 = (undefined8 *)
              ::std::__cxx11::string::replace((ulong)local_548,0,(char *)0x0,0x1e23bbf);
    paVar38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar30 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar30 == paVar38) {
      local_578._M_allocated_capacity = paVar38->_M_allocated_capacity;
      local_578._8_8_ = puVar30[3];
      local_588 = (undefined1  [8])&local_578;
    }
    else {
      local_578._M_allocated_capacity = paVar38->_M_allocated_capacity;
      local_588 = (undefined1  [8])*puVar30;
    }
    peStack_580 = (element_type *)puVar30[1];
    *puVar30 = paVar38;
    puVar30[1] = 0;
    *(undefined1 *)(puVar30 + 2) = 0;
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)local_588;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_5a8,__l_00,(allocator_type *)local_4d8._M_local_buf);
    if (local_588 != (undefined1  [8])&local_578) {
      operator_delete((void *)local_588);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_548._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_548 + 0x10)) {
      operator_delete((void *)local_548._0_8_);
    }
    BindContext::AddGenericBinding
              ((BindContext *)&ref->schema_name,iVar18,(string *)local_3a8,&local_5a8,
               (vector<duckdb::LogicalType,_true> *)local_508);
    peVar31 = (element_type *)operator_new(0x20);
    *(undefined1 *)
     &(peVar31->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
      super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = 8;
    peVar31->context = (ClientContext *)0x0;
    *(undefined ***)&(peVar31->super_enable_shared_from_this<duckdb::Binder>).__weak_this_ =
         &PTR__BoundTableRef_0248e2e0;
    (peVar31->CTE_bindings)._M_h._M_buckets = (__buckets_ptr)iVar18;
    (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar31;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_5a8);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_508);
    paVar38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a8._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_3a8 + 0x10)) {
LAB_011fa212:
      operator_delete(paVar38);
    }
  }
  else if ((ViewCatalogEntry *)local_5b0.ptr == (ViewCatalogEntry *)0x0) {
    BindWithReplacementScan
              (this,(ClientContext *)ref,
               (BaseTableRef *)(ref->super_TableRef).alias._M_dataplus._M_p);
    if ((this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
        super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0)
    {
      ReplacementScan::GetFullPath((string *)local_548,psVar36,local_4e0,(string *)pBVar24);
      context = (ClientContext *)(ref->super_TableRef).alias._M_dataplus._M_p;
      StringUtil::Lower((string *)local_3a8,(string *)local_548);
      pDVar20 = DBConfig::GetConfig(context);
      local_4a8._8_8_ = retriever;
      local_4a8._32_8_ = psVar36;
      if ((pDVar20->options).autoload_known_extensions == true) {
        lVar37 = 0x300;
        pcVar40 = ".parquet";
        do {
          local_588 = (undefined1  [8])&local_578;
          sVar21 = strlen(pcVar40);
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_588,pcVar40,pcVar40 + sVar21);
          bVar42 = StringUtil::EndsWith((string *)local_3a8,(string *)local_588);
          uVar22 = CONCAT71(extraout_var_00,bVar42);
          if (local_588 != (undefined1  [8])&local_578) {
            operator_delete((void *)local_588);
            uVar22 = extraout_RAX;
          }
          if (bVar42) {
            local_588 = (undefined1  [8])&local_578;
            sVar21 = strlen(pcVar40 + 0x30);
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_588,pcVar40 + 0x30,pcVar40 + sVar21 + 0x30);
            ExtensionHelper::AutoLoadExtension(context,(string *)local_588);
            uVar22 = extraout_RAX_00;
            if (local_588 != (undefined1  [8])&local_578) {
              operator_delete((void *)local_588);
              uVar22 = extraout_RAX_01;
            }
            if (bVar42) {
              aStack_558._8_4_ = (int)CONCAT71((int7)((ulong)uVar22 >> 8),1);
              goto LAB_011fa263;
            }
          }
          pcVar40 = pcVar40 + 0x60;
          lVar37 = lVar37 + -0x60;
        } while (lVar37 != 0);
        aStack_558._8_4_ = (int)CONCAT71((int7)((ulong)uVar22 >> 8),1);
        lVar37 = 0x180;
        pcVar40 = ".parquet?";
        do {
          local_588 = (undefined1  [8])&local_578;
          sVar21 = strlen(pcVar40);
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_588,pcVar40,pcVar40 + sVar21);
          bVar42 = StringUtil::Contains((string *)local_3a8,(string *)local_588);
          uVar22 = CONCAT71(extraout_var_01,bVar42);
          if (local_588 != (undefined1  [8])&local_578) {
            operator_delete((void *)local_588);
            uVar22 = extraout_RAX_02;
          }
          if (bVar42) {
            local_588 = (undefined1  [8])&local_578;
            sVar21 = strlen(pcVar40 + 0x30);
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_588,pcVar40 + 0x30,pcVar40 + sVar21 + 0x30);
            ExtensionHelper::AutoLoadExtension(context,(string *)local_588);
            uVar22 = extraout_RAX_03;
            if (local_588 != (undefined1  [8])&local_578) {
              operator_delete((void *)local_588);
              uVar22 = extraout_RAX_04;
            }
            if (bVar42) break;
          }
          pcVar40 = pcVar40 + 0x60;
          lVar37 = lVar37 + -0x60;
          aStack_558._8_4_ = (int)CONCAT71((int7)((ulong)uVar22 >> 8),lVar37 != 0);
        } while (lVar37 != 0);
      }
      else {
        aStack_558._8_8_ = aStack_558._8_8_ & 0xffffffff00000000;
      }
LAB_011fa263:
      paVar38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_3a8 + 0x10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._0_8_ != paVar38) {
        operator_delete((void *)local_3a8._0_8_);
      }
      if ((aStack_558._8_8_ & 1) == 0) {
LAB_011fa5f9:
        pDVar20 = DBConfig::GetConfig((ClientContext *)(ref->super_TableRef).alias._M_dataplus._M_p)
        ;
        if ((((ref->super_TableRef).alias._M_dataplus._M_p[0xec] == '\x01') &&
            ((pDVar20->options).enable_external_access == true)) &&
           (bVar42 = ExtensionHelper::IsFullPath((string *)local_548), bVar42)) {
          pFVar33 = FileSystem::GetFileSystem
                              ((ClientContext *)(ref->super_TableRef).alias._M_dataplus._M_p);
          iVar8 = (*pFVar33->_vptr_FileSystem[0x12])(pFVar33,local_548,0);
          if ((char)iVar8 != '\0') {
            pBVar17 = (BinderException *)__cxa_allocate_exception(0x10);
            local_3a8._0_8_ = paVar38;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_3a8,
                       "No extension found that is capable of reading the file \"%s\"\n* If this file is a supported file format you can explicitly use the reader functions, such as read_csv, read_json or read_parquet"
                       ,"");
            local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_110,local_548._0_8_,
                       (pointer)((long)&((_Alloc_hider *)local_548._8_8_)->_M_p + local_548._0_8_));
            BinderException::BinderException<std::__cxx11::string>
                      (pBVar17,(string *)local_3a8,&local_110);
            __cxa_throw(pBVar17,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
        }
        CatalogEntryRetriever::GetEntry
                  ((CatalogEntryRetriever *)local_4a8._8_8_,(string *)local_4a8._32_8_,local_4e0,
                   &local_438,THROW_EXCEPTION);
        pIVar32 = (InternalException *)__cxa_allocate_exception(0x10);
        local_3a8._0_8_ = paVar38;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_3a8,"Catalog::GetEntry should have thrown an exception above","")
        ;
        InternalException::InternalException(pIVar32,(string *)local_3a8);
        __cxa_throw(pIVar32,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      BindWithReplacementScan
                ((Binder *)local_3a8,(ClientContext *)ref,
                 (BaseTableRef *)(ref->super_TableRef).alias._M_dataplus._M_p);
      uVar22 = local_3a8._0_8_;
      local_3a8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      peVar31 = (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
      super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)uVar22;
      if (peVar31 != (element_type *)0x0) {
        (**(code **)(*(long *)&(peVar31->super_enable_shared_from_this<duckdb::Binder>).__weak_this_
                    + 8))();
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_3a8._0_8_ + 8))();
      }
      if ((this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
          super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0
         ) goto LAB_011fa5f9;
      paVar38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_548._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_548._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_548 + 0x10)) goto LAB_011fa212;
    }
  }
  else {
    optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&local_5b0);
    if ((local_5b0.ptr)->type == VIEW_ENTRY) {
      optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&local_5b0);
      oVar3.ptr = local_5b0.ptr;
      CreateBinder((Binder *)local_4b8,(ClientContext *)(ref->super_TableRef).alias._M_dataplus._M_p
                   ,(optional_ptr<duckdb::Binder,_true>)ref,VIEW_BINDER);
      pBVar23 = shared_ptr<duckdb::Binder,_true>::operator->
                          ((shared_ptr<duckdb::Binder,_true> *)local_4b8);
      pBVar23->can_contain_nulls = true;
      iVar8 = (*(((StandardEntry *)&(oVar3.ptr)->_vptr_CatalogEntry)->super_InCatalogEntry).
                super_CatalogEntry._vptr_CatalogEntry[0x10])(oVar3.ptr);
      (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar8) + 0x18))
                (local_4a8 + 0x10,(long *)CONCAT44(extraout_var_03,iVar8));
      local_460._M_head_impl = (SelectStatement *)local_4a8._16_8_;
      local_4a8._16_8_ = (ClientContext *)0x0;
      local_130._M_string_length = 0;
      local_130.field_2._M_local_buf[0] = false;
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      SubqueryRef::SubqueryRef
                ((SubqueryRef *)local_3a8,
                 (unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                  *)&local_460,&local_130);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p);
      }
      if ((ClientContext *)local_460._M_head_impl != (ClientContext *)0x0) {
        (*(code *)(((((weak_ptr<duckdb::ClientContext,_true> *)
                     &((local_460._M_head_impl)->super_SQLStatement)._vptr_SQLStatement)->internal).
                    super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
                  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi)();
      }
      local_460._M_head_impl = (SelectStatement *)0x0;
      if ((ClientContext *)local_4a8._16_8_ != (ClientContext *)0x0) {
        (*(code *)(((((enable_shared_from_this<duckdb::ClientContext> *)local_4a8._16_8_)->
                    __weak_this_).internal.
                    super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
                  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi)();
      }
      local_4a8._16_8_ = (ClientContext *)0x0;
      ::std::__cxx11::string::_M_assign((string *)(local_3a8 + 0x10));
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_5a8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&oVar3.ptr[1].comment.value_.hugeint);
      __y = &oVar3.ptr[1].tags._M_h._M_before_begin;
      if ((ulong)((long)local_5a8.
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_5a8.
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) <
          oVar3.ptr[1].tags._M_h._M_element_count -
          (long)oVar3.ptr[1].tags._M_h._M_before_begin._M_nxt) {
        __n_00 = (long)local_5a8.
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_5a8.
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5;
        do {
          pvVar12 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                  *)__y,__n_00);
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_5a8,pvVar12);
          __n_00 = __n_00 + 1;
        } while (__n_00 < (ulong)((long)(oVar3.ptr[1].tags._M_h._M_element_count -
                                        (long)oVar3.ptr[1].tags._M_h._M_before_begin._M_nxt) >> 5));
      }
      BindContext::AliasColumnNames
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)local_548,(string *)pBVar24,&local_5a8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)(in_RDX + 0x50));
      local_578._M_allocated_capacity = (size_type)local_348._M_nxt;
      peStack_580 = (element_type *)local_358._8_8_;
      local_588 = (undefined1  [8])local_358._M_allocated_capacity;
      local_358._M_allocated_capacity = local_548._0_8_;
      local_358._8_8_ = local_548._8_8_;
      local_348._M_nxt = (_Hash_node_base *)local_548._16_8_;
      local_548._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_548._8_8_ = (pointer)0x0;
      local_548._16_8_ = (pointer)0x0;
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_588);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_548);
      iVar8 = (*(((StandardEntry *)&(oVar3.ptr)->_vptr_CatalogEntry)->super_InCatalogEntry).
                super_CatalogEntry._vptr_CatalogEntry[0xb])(oVar3.ptr);
      iVar9 = (*(((StandardEntry *)&(oVar3.ptr)->_vptr_CatalogEntry)->super_InCatalogEntry).
                super_CatalogEntry._vptr_CatalogEntry[0xd])(oVar3.ptr);
      GetSearchPath((vector<duckdb::CatalogSearchEntry,_true> *)&local_4d8,pBVar24,
                    (Catalog *)CONCAT44(extraout_var_04,iVar8),
                    (string *)(CONCAT44(extraout_var_05,iVar9) + 0x20));
      pBVar24 = shared_ptr<duckdb::Binder,_true>::operator->
                          ((shared_ptr<duckdb::Binder,_true> *)local_4b8);
      local_188.
      super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)local_4d8._M_allocated_capacity;
      local_188.
      super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)local_4d8._8_8_;
      local_188.
      super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = local_4c8;
      local_4d8._M_allocated_capacity = 0;
      local_4d8._8_8_ = 0;
      local_4c8 = (pointer)0x0;
      CatalogEntryRetriever::SetSearchPath
                (&pBVar24->entry_retriever,(vector<duckdb::CatalogSearchEntry,_true> *)&local_188);
      ::std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>::
      ~vector(&local_188);
      pBVar24 = shared_ptr<duckdb::Binder,_true>::operator->
                          ((shared_ptr<duckdb::Binder,_true> *)local_4b8);
      CatalogEntryRetriever::SetAtClause(&pBVar24->entry_retriever,at_clause_p);
      pBVar24 = shared_ptr<duckdb::Binder,_true>::operator->
                          ((shared_ptr<duckdb::Binder,_true> *)local_4b8);
      AddBoundView(pBVar24,(ViewCatalogEntry *)oVar3.ptr);
      pBVar24 = shared_ptr<duckdb::Binder,_true>::operator->
                          ((shared_ptr<duckdb::Binder,_true> *)local_4b8);
      Bind(this,(SubqueryRef *)pBVar24,(CommonTableExpressionInfo *)local_3a8);
      pBVar24 = shared_ptr<duckdb::Binder,_true>::operator->
                          ((shared_ptr<duckdb::Binder,_true> *)local_4b8);
      if ((pBVar24->correlated_columns).
          super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
          super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pBVar24->correlated_columns).
          super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
          super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pBVar17 = (BinderException *)__cxa_allocate_exception(0x10);
        local_588 = (undefined1  [8])&local_578;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_588,
                   "Contents of view were altered - view bound correlated columns","");
        BinderException::BinderException(pBVar17,(string *)local_588);
        __cxa_throw(pBVar17,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      this_02 = unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>
                ::operator->((unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>
                              *)this);
      pBVar25 = BoundTableRef::Cast<duckdb::BoundSubqueryRef>(this_02);
      BVar7 = GetBindingMode((Binder *)ref);
      if ((BVar7 != EXTRACT_NAMES) &&
         (iVar8 = (*(((StandardEntry *)&(oVar3.ptr)->_vptr_CatalogEntry)->super_InCatalogEntry).
                    super_CatalogEntry._vptr_CatalogEntry[0x11])(oVar3.ptr), (char)iVar8 != '\0')) {
        this_00 = &pBVar25->subquery;
        pBVar26 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                  ::operator->(this_00);
        ExchangeAllNullTypes((vector<duckdb::LogicalType,_true> *)&local_478,&pBVar26->types);
        ExchangeAllNullTypes
                  ((vector<duckdb::LogicalType,_true> *)&local_450,
                   (vector<duckdb::LogicalType,_true> *)
                   &oVar3.ptr[1].comment.value_info_.internal.
                    super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        rhs = local_450.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_start;
        pLVar1 = local_478.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        pLVar27 = local_478.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if ((long)local_478.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_478.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_start !=
            (long)local_450.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_450.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_start) {
LAB_011f9a33:
          local_548._0_8_ = local_548 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_548,", ","");
          StringUtil::ToString<duckdb::LogicalType>
                    ((string *)local_588,(vector<duckdb::LogicalType,_true> *)&local_478,
                     (string *)local_548);
          if ((undefined1 *)local_548._0_8_ != local_548 + 0x10) {
            operator_delete((void *)local_548._0_8_);
          }
          pLVar1 = (pointer)(local_508 + 0x10);
          local_508._0_8_ = pLVar1;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_508,", ","");
          StringUtil::ToString<duckdb::LogicalType>
                    ((string *)local_548,(vector<duckdb::LogicalType,_true> *)&local_450,
                     (string *)local_508);
          if ((pointer)local_508._0_8_ != pLVar1) {
            operator_delete((void *)local_508._0_8_);
          }
          pBVar17 = (BinderException *)__cxa_allocate_exception(0x10);
          local_508._0_8_ = pLVar1;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_508,
                     "Contents of view were altered: types don\'t match! Expected [%s], but found [%s] instead"
                     ,"");
          local_150._M_allocated_capacity = (size_type)local_140;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_150,local_548._0_8_,
                     (pointer)((long)&((_Alloc_hider *)local_548._8_8_)->_M_p + local_548._0_8_));
          local_1c8._M_unused._M_object = local_1b8;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1c8,local_588,
                     (pointer)((long)&((_Alloc_hider *)&peStack_580->_vptr_ExtraTypeInfo)->_M_p +
                              (long)local_588));
          BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                    (pBVar17,(string *)local_508,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_150
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_1c8);
          __cxa_throw(pBVar17,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        bVar42 = local_478.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_start ==
                 local_478.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (!bVar42) {
          bVar42 = LogicalType::operator==
                             (local_478.
                              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              local_450.
                              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                              ._M_impl.super__Vector_impl_data._M_start);
          if (bVar42) {
            do {
              rhs = rhs + 1;
              pLVar27 = pLVar27 + 1;
              bVar42 = pLVar27 == pLVar1;
              if (bVar42) goto LAB_011f9f92;
              bVar42 = LogicalType::operator==(pLVar27,rhs);
            } while (bVar42);
          }
          goto LAB_011f9a33;
        }
LAB_011f9f92:
        if (!bVar42) goto LAB_011f9a33;
        pBVar26 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                  ::operator->(this_00);
        if ((long)(pBVar26->names).
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pBVar26->names).
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start ==
            oVar3.ptr[1].tags._M_h._M_element_count -
            (long)oVar3.ptr[1].tags._M_h._M_before_begin._M_nxt) {
          pBVar26 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                    ::operator->(this_00);
          bVar42 = ::std::operator!=(&(pBVar26->names).
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)__y);
          if (bVar42) {
            pBVar26 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                      ::operator->(this_00);
            local_548._0_8_ = local_548 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)local_548,", ","");
            StringUtil::Join((string *)local_588,&pBVar26->names,(string *)local_548);
            if ((undefined1 *)local_548._0_8_ != local_548 + 0x10) {
              operator_delete((void *)local_548._0_8_);
            }
            pLVar1 = (pointer)(local_508 + 0x10);
            local_508._0_8_ = pLVar1;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)local_508,", ","");
            StringUtil::Join((string *)local_548,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                              *)__y,(string *)local_508);
            if ((pointer)local_508._0_8_ != pLVar1) {
              operator_delete((void *)local_508._0_8_);
            }
            pBVar17 = (BinderException *)__cxa_allocate_exception(0x10);
            local_508._0_8_ = pLVar1;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_508,
                       "Contents of view were altered: names don\'t match! Expected [%s], but found [%s] instead"
                       ,"");
            local_170._0_8_ = local_170 + 0x10;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)local_170,local_548._0_8_,
                       (pointer)((long)&((_Alloc_hider *)local_548._8_8_)->_M_p + local_548._0_8_));
            local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1e8,local_588,
                       (pointer)((long)&((_Alloc_hider *)&peStack_580->_vptr_ExtraTypeInfo)->_M_p +
                                (long)local_588));
            BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                      (pBVar17,(string *)local_508,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_170,&local_1e8);
            __cxa_throw(pBVar17,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
        }
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  (&local_450);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  (&local_478);
      }
      pBVar26 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                ::operator->(&pBVar25->subquery);
      iVar8 = (*pBVar26->_vptr_BoundQueryNode[2])(pBVar26);
      subquery_00 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                    ::operator*(&pBVar25->subquery);
      BindContext::AddView
                ((BindContext *)&ref->schema_name,CONCAT44(extraout_var_06,iVar8),
                 (string *)(local_3a8 + 0x10),(SubqueryRef *)local_3a8,subquery_00,
                 (ViewCatalogEntry *)oVar3.ptr);
      ::std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>::
      ~vector((vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_> *)
              &local_4d8);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_5a8);
      local_3a8._0_8_ = &PTR__SubqueryRef_02493370;
      if (local_340._M_head_impl != (SelectStatement *)0x0) {
        (*((local_340._M_head_impl)->super_SQLStatement)._vptr_SQLStatement[1])();
      }
      local_340._M_head_impl = (SelectStatement *)0x0;
      TableRef::~TableRef((TableRef *)local_3a8);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4b8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4b8._8_8_);
      }
    }
    else {
      if ((local_5b0.ptr)->type != TABLE_ENTRY) {
        pIVar32 = (InternalException *)__cxa_allocate_exception(0x10);
        local_3a8._0_8_ = local_3a8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_3a8,"Catalog entry type","");
        InternalException::InternalException(pIVar32,(string *)local_3a8);
        __cxa_throw(pIVar32,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_450.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)GenerateTableIndex((Binder *)ref);
      optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&local_5b0);
      oVar3.ptr = local_5b0.ptr;
      this_01 = GetStatementProperties((Binder *)ref);
      iVar8 = (*(((StandardEntry *)&(oVar3.ptr)->_vptr_CatalogEntry)->super_InCatalogEntry).
                super_CatalogEntry._vptr_CatalogEntry[0xb])(oVar3.ptr);
      StatementProperties::RegisterDBRead
                (this_01,(Catalog *)CONCAT44(extraout_var_02,iVar8),
                 (ClientContext *)(ref->super_TableRef).alias._M_dataplus._M_p);
      local_4b8._0_8_ =
           (tuple<duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)0x0;
      (*(((StandardEntry *)&(oVar3.ptr)->_vptr_CatalogEntry)->super_InCatalogEntry).
        super_CatalogEntry._vptr_CatalogEntry[0x14])
                (local_3a8,oVar3.ptr,(ref->super_TableRef).alias._M_dataplus._M_p,local_4b8,
                 &local_438);
      local_508._0_8_ = (pointer)0x0;
      local_508._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_508._16_8_ = (pointer)0x0;
      local_5a8.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_5a8.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_5a8.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_4c8 = (pointer)0x0;
      local_4d8._M_allocated_capacity = 0;
      local_4d8._8_8_ = 0;
      local_478.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_478.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_start = (LogicalType *)0x0;
      local_478.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_finish = (LogicalType *)0x0;
      pCVar19 = TableCatalogEntry::GetColumns((TableCatalogEntry *)oVar3.ptr);
      CVar43 = ColumnList::Logical(pCVar19);
      pCVar19 = CVar43.list;
      if (((undefined1  [16])CVar43 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        local_578._8_8_ =
             ((long)(pCVar19->columns).
                    super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                    .
                    super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pCVar19->columns).
                    super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                    .
                    super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
      }
      else {
        local_578._8_8_ =
             (long)(pCVar19->physical_columns).
                   super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(pCVar19->physical_columns).
                   super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
      }
      peStack_580 = (element_type *)CONCAT71(peStack_580._1_7_,CVar43.physical);
      local_578._M_allocated_capacity = 0;
      if (((undefined1  [16])CVar43 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        sVar41 = ((long)(pCVar19->columns).
                        super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                        .
                        super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pCVar19->columns).
                        super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                        .
                        super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
      }
      else {
        sVar41 = (long)(pCVar19->physical_columns).
                       super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(pCVar19->physical_columns).
                       super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3;
      }
      if (((undefined1  [16])CVar43 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        lVar37 = ((long)(pCVar19->columns).
                        super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                        .
                        super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pCVar19->columns).
                        super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                        .
                        super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
      }
      else {
        lVar37 = (long)(pCVar19->physical_columns).
                       super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(pCVar19->physical_columns).
                       super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3;
      }
      local_588 = (undefined1  [8])pCVar19;
      if ((sVar41 != 0) || (local_578._8_8_ != lVar37)) {
        do {
          do {
            this_03 = ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator*
                                ((ColumnLogicalIteratorInternal *)local_588);
            pLVar27 = ColumnDefinition::Type(this_03);
            ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                      ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                       local_508,pLVar27);
            psVar28 = ColumnDefinition::Name_abi_cxx11_(this_03);
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_5a8,psVar28);
            pLVar27 = ColumnDefinition::Type(this_03);
            ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                      ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                       &local_4d8,pLVar27);
            psVar28 = ColumnDefinition::Name_abi_cxx11_(this_03);
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_478,psVar28);
            local_578._M_allocated_capacity = local_578._M_allocated_capacity + 1;
          } while (local_578._M_allocated_capacity != sVar41);
        } while ((local_578._8_8_ != lVar37) || (local_588 != (undefined1  [8])pCVar19));
      }
      BindContext::AliasColumnNames
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)local_548,(string *)pBVar24,&local_5a8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)(in_RDX + 0x50));
      local_578._M_allocated_capacity =
           (size_type)
           local_5a8.
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      peStack_580 = (element_type *)
                    local_5a8.
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
      local_588 = (undefined1  [8])
                  local_5a8.
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      local_5a8.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_548._0_8_;
      local_5a8.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_548._8_8_;
      local_5a8.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_548._16_8_;
      local_548._0_8_ = (pointer)0x0;
      local_548._8_8_ = (pointer)0x0;
      local_548._16_8_ = (pointer)0x0;
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_588);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_548);
      local_588 = (undefined1  [8])&aStack_558;
      peStack_580 = (element_type *)&DAT_00000001;
      local_578._M_allocated_capacity = 0;
      local_578._8_8_ = 0;
      local_568 = 1.0;
      local_560 = 0;
      aStack_558._M_allocated_capacity = 0;
      if (local_228._M_nxt == (_Hash_node_base *)0x0) {
        (*(((StandardEntry *)&(oVar3.ptr)->_vptr_CatalogEntry)->super_InCatalogEntry).
          super_CatalogEntry._vptr_CatalogEntry[0x19])(local_548,oVar3.ptr);
        ::std::
        _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::_M_move_assign((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          *)local_588,local_548);
      }
      else {
        (*(code *)local_228._M_nxt)
                  (local_548,(ref->super_TableRef).alias._M_dataplus._M_p,local_4b8._0_8_);
        ::std::
        _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::_M_move_assign((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          *)local_588,local_548);
      }
      ::std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)local_548);
      make_uniq<duckdb::LogicalGet,unsigned_long&,duckdb::TableFunction&,duckdb::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>,duckdb::vector<duckdb::LogicalType,true>,duckdb::vector<std::__cxx11::string,true>,std::unordered_map<unsigned_long,duckdb::TableColumn,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::TableColumn>>>>
                ((duckdb *)local_548,(unsigned_long *)&local_450,(TableFunction *)local_3a8,
                 (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                  *)local_4b8,(vector<duckdb::LogicalType,_true> *)&local_4d8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)&local_478,
                 (unordered_map<unsigned_long,_duckdb::TableColumn,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>_>
                  *)local_588);
      pLVar29 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
                operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                            *)local_548);
      local_458._M_nxt = (_Hash_node_base *)LogicalGet::GetTable(pLVar29);
      pLVar29 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
                operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                            *)local_548);
      bound_column_ids = LogicalGet::GetMutableColumnIds(pLVar29);
      pLVar1 = local_450.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_start;
      if ((TableCatalogEntry *)local_458._M_nxt == (TableCatalogEntry *)0x0) {
        BindContext::AddBaseTable
                  ((BindContext *)&ref->schema_name,
                   (idx_t)local_450.
                          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                          ._M_impl.super__Vector_impl_data._M_start,(string *)(in_RDX + 0x10),
                   &local_5a8,(vector<duckdb::LogicalType,_true> *)local_508,bound_column_ids,
                   (string *)pBVar24);
      }
      else {
        optional_ptr<duckdb::TableCatalogEntry,_true>::CheckValid
                  ((optional_ptr<duckdb::TableCatalogEntry,_true> *)&local_458);
        BindContext::AddBaseTable
                  ((BindContext *)&ref->schema_name,(idx_t)pLVar1,(string *)(in_RDX + 0x10),
                   &local_5a8,(vector<duckdb::LogicalType,_true> *)local_508,bound_column_ids,
                   (TableCatalogEntry *)local_458._M_nxt,true);
      }
      peVar31 = (element_type *)operator_new(0x28);
      uVar22 = local_548._0_8_;
      local_548._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      *(undefined1 *)
       &(peVar31->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
        super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = 1;
      peVar31->context = (ClientContext *)0x0;
      *(undefined ***)&(peVar31->super_enable_shared_from_this<duckdb::Binder>).__weak_this_ =
           &PTR__BoundBaseTableRef_0248e318;
      (peVar31->CTE_bindings)._M_h._M_buckets = (__buckets_ptr)oVar3.ptr;
      (peVar31->CTE_bindings)._M_h._M_bucket_count = uVar22;
      (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
      super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar31;
      ::std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)local_588);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_478);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_4d8);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_5a8);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_508);
      local_3a8._0_8_ = &PTR__TableFunction_024749e8;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_200._M_nxt !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_200._M_nxt);
      }
      SimpleNamedParameterFunction::~SimpleNamedParameterFunction
                ((SimpleNamedParameterFunction *)local_3a8);
      if ((FunctionData *)local_4b8._0_8_ != (FunctionData *)0x0) {
        (**(code **)(*(long *)local_4b8._0_8_ + 8))();
      }
    }
  }
  if ((element_type *)local_4a8._0_8_ != (element_type *)0x0) {
    ::std::default_delete<duckdb::BoundAtClause>::operator()
              ((default_delete<duckdb::BoundAtClause> *)local_4a8,(BoundAtClause *)local_4a8._0_8_);
  }
LAB_011fa231:
  if (local_4c0 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_4c0);
  }
  return (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>)
         (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>)this;
}

Assistant:

unique_ptr<BoundTableRef> Binder::Bind(BaseTableRef &ref) {
	QueryErrorContext error_context(ref.query_location);
	// CTEs and views are also referred to using BaseTableRefs, hence need to distinguish here
	// check if the table name refers to a CTE

	// CTE name should never be qualified (i.e. schema_name should be empty)
	// unless we want to refer to the recurring table of "using key".
	vector<reference<CommonTableExpressionInfo>> found_ctes;
	if (ref.schema_name.empty() || ref.schema_name == "recurring") {
		found_ctes = FindCTE(ref.table_name, ref.table_name == alias);
	}

	if (!found_ctes.empty()) {
		// Check if there is a CTE binding in the BindContext
		bool circular_cte = false;
		for (auto found_cte : found_ctes) {
			auto &cte = found_cte.get();
			auto ctebinding = bind_context.GetCTEBinding(ref.table_name);
			if (ctebinding && (cte.query->node->type == QueryNodeType::RECURSIVE_CTE_NODE ||
			                   cte.materialized == CTEMaterialize::CTE_MATERIALIZE_ALWAYS)) {
				// There is a CTE binding in the BindContext.
				// This can only be the case if there is a recursive CTE,
				// or a materialized CTE present.
				auto index = GenerateTableIndex();
				auto materialized = cte.materialized;
				if (materialized == CTEMaterialize::CTE_MATERIALIZE_DEFAULT) {
#ifdef DUCKDB_ALTERNATIVE_VERIFY
					materialized = CTEMaterialize::CTE_MATERIALIZE_ALWAYS;
#else
					materialized = CTEMaterialize::CTE_MATERIALIZE_NEVER;
#endif
				}

				if (ref.schema_name == "recurring" && cte.key_targets.empty()) {
					throw InvalidInputException("RECURRING can only be used with USING KEY in recursive CTE.");
				}

				auto result =
				    make_uniq<BoundCTERef>(index, ctebinding->index, materialized, ref.schema_name == "recurring");
				auto alias = ref.alias.empty() ? ref.table_name : ref.alias;
				auto names = BindContext::AliasColumnNames(alias, ctebinding->names, ref.column_name_alias);

				bind_context.AddGenericBinding(index, alias, names, ctebinding->types);

				auto cte_reference = ref.schema_name.empty() ? ref.table_name : ref.schema_name + "." + ref.table_name;

				// Update references to CTE
				auto cteref = bind_context.cte_references[cte_reference];

				if (cteref == nullptr && ref.schema_name == "recurring") {
					throw BinderException("There is a WITH item named \"%s\", but the recurring table cannot be "
					                      "referenced from this part of the query.",
					                      ref.table_name);
				}

				(*cteref)++;

				result->types = ctebinding->types;
				result->bound_columns = std::move(names);
				return std::move(result);
			} else {
				if (CTEIsAlreadyBound(cte)) {
					// remember error state
					circular_cte = true;
					// retry with next candidate CTE
					continue;
				}

				// If we have found a materialized CTE, but no corresponding CTE binding,
				// something is wrong.
				if (cte.materialized == CTEMaterialize::CTE_MATERIALIZE_ALWAYS) {
					throw BinderException(
					    "There is a WITH item named \"%s\", but it cannot be referenced from this part of the query.",
					    ref.table_name);
				}

				if (ref.schema_name == "recurring") {
					throw BinderException("There is a WITH item named \"%s\", but the recurring table cannot be "
					                      "referenced from this part of the query.",
					                      ref.table_name);
				}

				// Move CTE to subquery and bind recursively
				SubqueryRef subquery(unique_ptr_cast<SQLStatement, SelectStatement>(cte.query->Copy()));
				subquery.alias = ref.alias.empty() ? ref.table_name : ref.alias;
				subquery.column_name_alias = cte.aliases;
				for (idx_t i = 0; i < ref.column_name_alias.size(); i++) {
					if (i < subquery.column_name_alias.size()) {
						subquery.column_name_alias[i] = ref.column_name_alias[i];
					} else {
						subquery.column_name_alias.push_back(ref.column_name_alias[i]);
					}
				}
				return Bind(subquery, &found_cte.get());
			}
		}
		if (circular_cte) {
			auto replacement_scan_bind_result = BindWithReplacementScan(context, ref);
			if (replacement_scan_bind_result) {
				return replacement_scan_bind_result;
			}

			throw BinderException(
			    "Circular reference to CTE \"%s\", There are two possible solutions. \n1. use WITH RECURSIVE to "
			    "use recursive CTEs. \n2. If "
			    "you want to use the TABLE name \"%s\" the same as the CTE name, please explicitly add "
			    "\"SCHEMA\" before table name. You can try \"main.%s\" (main is the duckdb default schema)",
			    ref.table_name, ref.table_name, ref.table_name);
		}
	}
	// not a CTE
	// extract a table or view from the catalog
	auto at_clause = BindAtClause(ref.at_clause);
	auto entry_at_clause = at_clause ? at_clause.get() : entry_retriever.GetAtClause();
	EntryLookupInfo table_lookup(CatalogType::TABLE_ENTRY, ref.table_name, entry_at_clause, error_context);
	BindSchemaOrCatalog(entry_retriever, ref.catalog_name, ref.schema_name);
	auto table_or_view =
	    entry_retriever.GetEntry(ref.catalog_name, ref.schema_name, table_lookup, OnEntryNotFound::RETURN_NULL);
	// we still didn't find the table
	if (GetBindingMode() == BindingMode::EXTRACT_NAMES) {
		if (!table_or_view || table_or_view->type == CatalogType::TABLE_ENTRY) {
			// if we are in EXTRACT_NAMES, we create a dummy table ref
			AddTableName(ref.table_name);

			// add a bind context entry
			auto table_index = GenerateTableIndex();
			auto alias = ref.alias.empty() ? ref.table_name : ref.alias;
			vector<LogicalType> types {LogicalType::INTEGER};
			vector<string> names {"__dummy_col" + to_string(table_index)};
			bind_context.AddGenericBinding(table_index, alias, names, types);
			return make_uniq_base<BoundTableRef, BoundEmptyTableRef>(table_index);
		}
	}
	if (!table_or_view) {
		// table could not be found: try to bind a replacement scan
		// Try replacement scan bind
		auto replacement_scan_bind_result = BindWithReplacementScan(context, ref);
		if (replacement_scan_bind_result) {
			return replacement_scan_bind_result;
		}

		// Try autoloading an extension, then retry the replacement scan bind
		auto full_path = ReplacementScan::GetFullPath(ref.catalog_name, ref.schema_name, ref.table_name);
		auto extension_loaded = TryLoadExtensionForReplacementScan(context, full_path);
		if (extension_loaded) {
			replacement_scan_bind_result = BindWithReplacementScan(context, ref);
			if (replacement_scan_bind_result) {
				return replacement_scan_bind_result;
			}
		}
		auto &config = DBConfig::GetConfig(context);
		if (context.config.use_replacement_scans && config.options.enable_external_access &&
		    ExtensionHelper::IsFullPath(full_path)) {
			auto &fs = FileSystem::GetFileSystem(context);
			if (fs.FileExists(full_path)) {
				throw BinderException(
				    "No extension found that is capable of reading the file \"%s\"\n* If this file is a supported file "
				    "format you can explicitly use the reader functions, such as read_csv, read_json or read_parquet",
				    full_path);
			}
		}

		// could not find an alternative: bind again to get the error
		(void)entry_retriever.GetEntry(ref.catalog_name, ref.schema_name, table_lookup,
		                               OnEntryNotFound::THROW_EXCEPTION);
		throw InternalException("Catalog::GetEntry should have thrown an exception above");
	}

	switch (table_or_view->type) {
	case CatalogType::TABLE_ENTRY: {
		// base table: create the BoundBaseTableRef node
		auto table_index = GenerateTableIndex();
		auto &table = table_or_view->Cast<TableCatalogEntry>();

		auto &properties = GetStatementProperties();
		properties.RegisterDBRead(table.ParentCatalog(), context);

		unique_ptr<FunctionData> bind_data;
		auto scan_function = table.GetScanFunction(context, bind_data, table_lookup);
		// TODO: bundle the type and name vector in a struct (e.g PackedColumnMetadata)
		vector<LogicalType> table_types;
		vector<string> table_names;
		vector<TableColumnType> table_categories;

		vector<LogicalType> return_types;
		vector<string> return_names;
		for (auto &col : table.GetColumns().Logical()) {
			table_types.push_back(col.Type());
			table_names.push_back(col.Name());
			return_types.push_back(col.Type());
			return_names.push_back(col.Name());
		}
		table_names = BindContext::AliasColumnNames(ref.table_name, table_names, ref.column_name_alias);

		virtual_column_map_t virtual_columns;
		if (scan_function.get_virtual_columns) {
			virtual_columns = scan_function.get_virtual_columns(context, bind_data.get());
		} else {
			virtual_columns = table.GetVirtualColumns();
		}
		auto logical_get =
		    make_uniq<LogicalGet>(table_index, scan_function, std::move(bind_data), std::move(return_types),
		                          std::move(return_names), std::move(virtual_columns));
		auto table_entry = logical_get->GetTable();
		auto &col_ids = logical_get->GetMutableColumnIds();
		if (!table_entry) {
			bind_context.AddBaseTable(table_index, ref.alias, table_names, table_types, col_ids, ref.table_name);
		} else {
			bind_context.AddBaseTable(table_index, ref.alias, table_names, table_types, col_ids, *table_entry);
		}
		return make_uniq_base<BoundTableRef, BoundBaseTableRef>(table, std::move(logical_get));
	}
	case CatalogType::VIEW_ENTRY: {
		// the node is a view: get the query that the view represents
		auto &view_catalog_entry = table_or_view->Cast<ViewCatalogEntry>();
		// We need to use a new binder for the view that doesn't reference any CTEs
		// defined for this binder so there are no collisions between the CTEs defined
		// for the view and for the current query
		auto view_binder = Binder::CreateBinder(context, this, BinderType::VIEW_BINDER);
		view_binder->can_contain_nulls = true;
		SubqueryRef subquery(unique_ptr_cast<SQLStatement, SelectStatement>(view_catalog_entry.GetQuery().Copy()));
		subquery.alias = ref.alias;
		// construct view names by first (1) taking the view aliases, (2) adding the view names, then (3) applying
		// subquery aliases
		vector<string> view_names = view_catalog_entry.aliases;
		for (idx_t n = view_names.size(); n < view_catalog_entry.names.size(); n++) {
			view_names.push_back(view_catalog_entry.names[n]);
		}
		subquery.column_name_alias = BindContext::AliasColumnNames(ref.table_name, view_names, ref.column_name_alias);

		// when binding a view, we always look into the catalog/schema where the view is stored first
		auto view_search_path =
		    GetSearchPath(view_catalog_entry.ParentCatalog(), view_catalog_entry.ParentSchema().name);
		view_binder->entry_retriever.SetSearchPath(std::move(view_search_path));
		// propagate the AT clause through the view
		view_binder->entry_retriever.SetAtClause(entry_at_clause);

		// bind the child subquery
		view_binder->AddBoundView(view_catalog_entry);
		auto bound_child = view_binder->Bind(subquery);
		if (!view_binder->correlated_columns.empty()) {
			throw BinderException("Contents of view were altered - view bound correlated columns");
		}

		D_ASSERT(bound_child->type == TableReferenceType::SUBQUERY);
		// verify that the types and names match up with the expected types and names if the view has type info defined
		auto &bound_subquery = bound_child->Cast<BoundSubqueryRef>();
		if (GetBindingMode() != BindingMode::EXTRACT_NAMES && view_catalog_entry.HasTypes()) {
			// we bind the view subquery and the original view with different "can_contain_nulls",
			// but we don't want to throw an error when SQLNULL does not match up with INTEGER,
			// so we exchange all SQLNULL with INTEGER here before comparing
			auto bound_types = ExchangeAllNullTypes(bound_subquery.subquery->types);
			auto view_types = ExchangeAllNullTypes(view_catalog_entry.types);
			if (bound_types != view_types) {
				auto actual_types = StringUtil::ToString(bound_types, ", ");
				auto expected_types = StringUtil::ToString(view_types, ", ");
				throw BinderException(
				    "Contents of view were altered: types don't match! Expected [%s], but found [%s] instead",
				    expected_types, actual_types);
			}
			if (bound_subquery.subquery->names.size() == view_catalog_entry.names.size() &&
			    bound_subquery.subquery->names != view_catalog_entry.names) {
				auto actual_names = StringUtil::Join(bound_subquery.subquery->names, ", ");
				auto expected_names = StringUtil::Join(view_catalog_entry.names, ", ");
				throw BinderException(
				    "Contents of view were altered: names don't match! Expected [%s], but found [%s] instead",
				    expected_names, actual_names);
			}
		}
		bind_context.AddView(bound_subquery.subquery->GetRootIndex(), subquery.alias, subquery,
		                     *bound_subquery.subquery, view_catalog_entry);
		return bound_child;
	}
	default:
		throw InternalException("Catalog entry type");
	}
}